

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlRegAtomAddRange(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom,int neg,xmlRegAtomType type,
                       int start,int end,xmlChar *blockName)

{
  int iVar1;
  xmlRegRangePtr *ppxVar2;
  xmlRegRangePtr pxVar3;
  char *extra;
  
  if (atom == (xmlRegAtomPtr)0x0) {
    ctxt->error = 0x5aa;
    extra = "add range: atom is NULL";
  }
  else {
    if (atom->type == XML_REGEXP_RANGES) {
      iVar1 = atom->maxRanges;
      if ((long)iVar1 == 0) {
        atom->maxRanges = 4;
        ppxVar2 = (xmlRegRangePtr *)(*xmlMalloc)(0x20);
        atom->ranges = ppxVar2;
        if (ppxVar2 == (xmlRegRangePtr *)0x0) {
          xmlRegexpErrMemory(ctxt,"adding ranges");
          atom->maxRanges = 0;
          return;
        }
      }
      else if (iVar1 <= atom->nbRanges) {
        atom->maxRanges = iVar1 * 2;
        ppxVar2 = (xmlRegRangePtr *)(*xmlRealloc)(atom->ranges,(long)iVar1 << 4);
        if (ppxVar2 == (xmlRegRangePtr *)0x0) {
          xmlRegexpErrMemory(ctxt,"adding ranges");
          atom->maxRanges = atom->maxRanges / 2;
          return;
        }
        atom->ranges = ppxVar2;
      }
      pxVar3 = (xmlRegRangePtr)(*xmlMalloc)(0x18);
      if (pxVar3 == (xmlRegRangePtr)0x0) {
        xmlRegexpErrMemory(ctxt,"allocating range");
        pxVar3 = (xmlRegRangePtr)0x0;
      }
      else {
        pxVar3->neg = neg;
        pxVar3->type = type;
        pxVar3->start = start;
        pxVar3->end = end;
      }
      if (pxVar3 != (xmlRegRangePtr)0x0) {
        pxVar3->blockName = blockName;
        iVar1 = atom->nbRanges;
        atom->nbRanges = iVar1 + 1;
        atom->ranges[iVar1] = pxVar3;
      }
      return;
    }
    ctxt->error = 0x5aa;
    extra = "add range: atom is not ranges";
  }
  xmlRegexpErrCompile(ctxt,extra);
  return;
}

Assistant:

static void
xmlRegAtomAddRange(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom,
	           int neg, xmlRegAtomType type, int start, int end,
		   xmlChar *blockName) {
    xmlRegRangePtr range;

    if (atom == NULL) {
	ERROR("add range: atom is NULL");
	return;
    }
    if (atom->type != XML_REGEXP_RANGES) {
	ERROR("add range: atom is not ranges");
	return;
    }
    if (atom->maxRanges == 0) {
	atom->maxRanges = 4;
	atom->ranges = (xmlRegRangePtr *) xmlMalloc(atom->maxRanges *
		                             sizeof(xmlRegRangePtr));
	if (atom->ranges == NULL) {
	    xmlRegexpErrMemory(ctxt, "adding ranges");
	    atom->maxRanges = 0;
	    return;
	}
    } else if (atom->nbRanges >= atom->maxRanges) {
	xmlRegRangePtr *tmp;
	atom->maxRanges *= 2;
	tmp = (xmlRegRangePtr *) xmlRealloc(atom->ranges, atom->maxRanges *
		                             sizeof(xmlRegRangePtr));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt, "adding ranges");
	    atom->maxRanges /= 2;
	    return;
	}
	atom->ranges = tmp;
    }
    range = xmlRegNewRange(ctxt, neg, type, start, end);
    if (range == NULL)
	return;
    range->blockName = blockName;
    atom->ranges[atom->nbRanges++] = range;

}